

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O2

dis_res * do_dis(decoctx *deco,uint32_t cur)

{
  ulong *puVar1;
  uint uVar2;
  int iVar3;
  dis_res *status;
  easm_insn *peVar4;
  easm_subinsn **ppeVar5;
  easm_subinsn *peVar6;
  easm_expr **__ptr;
  easm_expr *peVar7;
  easm_sinsn *peVar8;
  insn *v;
  int iVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  bool bVar13;
  int local_6c;
  disctx local_68;
  easm_insn *local_38;
  
  local_68.atomsnum = 0;
  local_68.atomsmax = 0;
  local_68.endmark = 0;
  local_68._44_4_ = 0;
  local_68.oplen = 0;
  local_68._20_4_ = 0;
  local_68.atoms = (litem **)0x0;
  status = (dis_res *)calloc(0x48,1);
  uVar2 = ed_getcstride(deco->isa,deco->varinfo);
  bVar12 = 0;
  uVar11 = 0;
  while ((uVar11 != 0x10 && ((int)((uVar11 & 0xffffffff) / (ulong)uVar2) + cur < deco->codesz))) {
    puVar1 = (ulong *)((long)status->a + (ulong)((uint)uVar11 & 0xfffffff8));
    *puVar1 = *puVar1 | (ulong)deco->code[uVar2 * cur + (uint)uVar11] << (bVar12 & 0x38);
    uVar11 = uVar11 + 1;
    bVar12 = bVar12 + 8;
  }
  local_68.isa = deco->isa;
  local_68.varinfo = deco->varinfo;
  v = (local_68.isa)->tsched;
  if ((v == (insn *)0x0) || (cur % (uint)(local_68.isa)->schedpos != 0)) {
    v = (local_68.isa)->troot;
  }
  atomtab_d(&local_68,status->a,status->m,v);
  status->oplen = local_68.oplen;
  if (deco->codesz < cur + local_68.oplen) {
    *(undefined1 *)&status->status = (char)status->status | DIS_STATUS_EOF;
  }
  if (local_68.oplen == 0) {
    *(undefined1 *)&status->status = (char)status->status | DIS_STATUS_UNK_FORM;
    status->oplen = (local_68.isa)->opunit;
  }
  status->endmark = local_68.endmark;
  local_6c = 0;
  peVar4 = (easm_insn *)calloc(0x28,1);
  peVar4->subinsnsmax = 0x10;
  ppeVar5 = (easm_subinsn **)malloc(0x80);
  peVar4->subinsns = ppeVar5;
  local_38 = peVar4;
  peVar6 = (easm_subinsn *)calloc(0x30,1);
  __ptr = (easm_expr **)0x0;
  iVar9 = 0;
  lVar10 = 0;
  iVar3 = 0;
  while (local_68.atoms[iVar3]->type != LITEM_NAME) {
    if (iVar9 <= lVar10) {
      bVar13 = iVar9 == 0;
      iVar9 = iVar9 * 2;
      if (bVar13) {
        iVar9 = 0x10;
      }
      peVar6->prefsmax = iVar9;
      __ptr = (easm_expr **)realloc(__ptr,(long)iVar9 << 3);
      peVar6->prefs = __ptr;
    }
    peVar7 = dis_parse_expr(&local_68,(dis_status *)status,&local_6c);
    peVar6->prefsnum = (int)(lVar10 + 1);
    __ptr[lVar10] = peVar7;
    lVar10 = lVar10 + 1;
    iVar3 = local_6c;
  }
  peVar8 = dis_parse_sinsn(&local_68,(dis_status *)status,&local_6c);
  peVar6->sinsn = peVar8;
  iVar9 = local_38->subinsnsnum;
  local_38->subinsnsnum = iVar9 + 1;
  local_38->subinsns[iVar9] = peVar6;
  if (local_6c != local_68.atomsnum) {
    abort();
  }
  status->insn = local_38;
  iVar9 = local_6c;
  for (lVar10 = 0; lVar10 < iVar9; lVar10 = lVar10 + 1) {
    free(local_68.atoms[lVar10]);
    iVar9 = local_68.atomsnum;
  }
  free(local_68.atoms);
  return status;
}

Assistant:

struct dis_res *do_dis(struct decoctx *deco, uint32_t cur) {
	struct disctx c = { 0 };
	struct disctx *ctx = &c;
	struct dis_res *res = calloc(sizeof *res, 1);
	int i;
	int stride = ed_getcstride(deco->isa, deco->varinfo);
	for (i = 0; i < MAXOPLEN*8 && cur + i/stride < deco->codesz; i++) {
		res->a[i/8] |= (ull)deco->code[cur*stride + i] << (i&7)*8;
	}
	ctx->isa = deco->isa;
	ctx->varinfo = deco->varinfo;
	if (deco->isa->tsched && (cur % deco->isa->schedpos) == 0)
		atomtab_d (ctx, res->a, res->m, deco->isa->tsched);
	else
		atomtab_d (ctx, res->a, res->m, deco->isa->troot);
	res->oplen = ctx->oplen;
	if (res->oplen + cur > deco->codesz)
		res->status |= DIS_STATUS_EOF;
	if (res->oplen == 0) {
		res->status |= DIS_STATUS_UNK_FORM;
		res->oplen = ctx->isa->opunit;
	}
	res->endmark = ctx->endmark;
	/* XXX unused status */
	res->insn = dis_parse_insn(ctx, &res->status);

	for (i = 0; i < ctx->atomsnum; ++i)
		free(ctx->atoms[i]);
	free(ctx->atoms);

	return res;
}